

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpEntrySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpEntrySyntax,slang::syntax::SyntaxList<slang::syntax::UdpFieldBaseSyntax>const&,slang::parsing::Token&,slang::syntax::UdpFieldBaseSyntax*&,slang::parsing::Token&,slang::syntax::UdpFieldBaseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::UdpFieldBaseSyntax> *args,Token *args_1,
          UdpFieldBaseSyntax **args_2,Token *args_3,UdpFieldBaseSyntax **args_4,Token *args_5)

{
  Token colon1;
  Token colon2;
  Token semi;
  UdpEntrySyntax *pUVar1;
  undefined8 in_RCX;
  Info *in_RDX;
  undefined8 in_RSI;
  Info *in_RDI;
  undefined8 *in_R8;
  Info *in_R9;
  long in_stack_00000008;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pUVar1 = (UdpEntrySyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  colon1.info = in_R9;
  colon1._0_8_ = in_RDX->location;
  colon2.info = in_RDX;
  colon2.kind = (short)in_RCX;
  colon2._2_1_ = (char)((ulong)in_RCX >> 0x10);
  colon2.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  colon2.rawLen = (int)((ulong)in_RCX >> 0x20);
  semi.info = in_RDI;
  semi.kind = (short)in_RSI;
  semi._2_1_ = (char)((ulong)in_RSI >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  semi.rawLen = (int)((ulong)in_RSI >> 0x20);
  slang::syntax::UdpEntrySyntax::UdpEntrySyntax
            ((UdpEntrySyntax *)in_RDX->rawTextPtr,
             (SyntaxList<slang::syntax::UdpFieldBaseSyntax> *)in_R8[1],colon1,
             (UdpFieldBaseSyntax *)*in_R8,colon2,*(UdpFieldBaseSyntax **)(in_stack_00000008 + 8),
             semi);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }